

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::segment::Atlas::resetCharts(Atlas *this)

{
  int *piVar1;
  Chart **ppCVar2;
  uint *puVar3;
  Vector3 local_68;
  Vector3 local_5c;
  Vector3 local_50;
  Vector3 local_44;
  Vector3 local_38;
  uint local_2c;
  Chart *pCStack_28;
  uint32_t seed;
  Chart *chart;
  uint32_t i_1;
  uint32_t chartCount;
  uint32_t i;
  uint32_t faceCount;
  Atlas *this_local;
  
  _i = this;
  chartCount = Mesh::faceCount(this->m_mesh);
  for (i_1 = 0; i_1 < chartCount; i_1 = i_1 + 1) {
    piVar1 = Array<int>::operator[](&this->m_faceCharts,i_1);
    *piVar1 = -1;
  }
  this->m_facesLeft = chartCount;
  chart._4_4_ = Array<xatlas::internal::segment::Chart_*>::size(&this->m_charts);
  for (chart._0_4_ = 0; (uint32_t)chart < chart._4_4_; chart._0_4_ = (uint32_t)chart + 1) {
    ppCVar2 = Array<xatlas::internal::segment::Chart_*>::operator[](&this->m_charts,(uint32_t)chart)
    ;
    pCStack_28 = *ppCVar2;
    puVar3 = Array<unsigned_int>::back(&pCStack_28->seeds);
    local_2c = *puVar3;
    pCStack_28->area = 0.0;
    pCStack_28->boundaryLength = 0.0;
    Vector3::Vector3(&local_38,0.0);
    (pCStack_28->basis).normal.x = local_38.x;
    (pCStack_28->basis).normal.y = local_38.y;
    (pCStack_28->basis).normal.z = local_38.z;
    Vector3::Vector3(&local_44,0.0);
    (pCStack_28->basis).tangent.x = local_44.x;
    (pCStack_28->basis).tangent.y = local_44.y;
    (pCStack_28->basis).tangent.z = local_44.z;
    Vector3::Vector3(&local_50,0.0);
    (pCStack_28->basis).bitangent.x = local_50.x;
    (pCStack_28->basis).bitangent.y = local_50.y;
    (pCStack_28->basis).bitangent.z = local_50.z;
    Vector3::Vector3(&local_5c,0.0);
    (pCStack_28->centroidSum).x = local_5c.x;
    (pCStack_28->centroidSum).y = local_5c.y;
    (pCStack_28->centroidSum).z = local_5c.z;
    Vector3::Vector3(&local_68,0.0);
    (pCStack_28->centroid).x = local_68.x;
    (pCStack_28->centroid).y = local_68.y;
    (pCStack_28->centroid).z = local_68.z;
    Array<unsigned_int>::clear(&pCStack_28->faces);
    CostQueue::clear(&pCStack_28->candidates);
    Array<unsigned_int>::clear(&pCStack_28->failedPlanarRegions);
    addFaceToChart(this,pCStack_28,local_2c);
  }
  return;
}

Assistant:

void resetCharts()
	{
		XA_PROFILE_START(buildAtlasResetCharts)
		const uint32_t faceCount = m_mesh->faceCount();
		for (uint32_t i = 0; i < faceCount; i++)
			m_faceCharts[i] = -1;
		m_facesLeft = faceCount;
		const uint32_t chartCount = m_charts.size();
		for (uint32_t i = 0; i < chartCount; i++) {
			Chart *chart = m_charts[i];
			const uint32_t seed = chart->seeds.back();
			chart->area = 0.0f;
			chart->boundaryLength = 0.0f;
			chart->basis.normal = Vector3(0.0f);
			chart->basis.tangent = Vector3(0.0f);
			chart->basis.bitangent = Vector3(0.0f);
			chart->centroidSum = Vector3(0.0f);
			chart->centroid = Vector3(0.0f);
			chart->faces.clear();
			chart->candidates.clear();
			chart->failedPlanarRegions.clear();
			addFaceToChart(chart, seed);
		}
		XA_PROFILE_END(buildAtlasResetCharts)
	}